

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  long in_RDI;
  float fVar4;
  float border_y;
  ImU32 outer_col;
  ImRect outer_border;
  float draw_y2;
  ImU32 col;
  bool is_frozen_separator;
  bool is_resizable;
  bool is_resized;
  bool is_hovered;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float draw_y2_head;
  float draw_y2_body;
  float draw_y1;
  float border_size;
  ImGuiTableInstanceData *table_instance;
  ImDrawList *inner_drawlist;
  ImGuiWindow *inner_window;
  ImGuiTable *in_stack_fffffffffffffef8;
  ImDrawList *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff10;
  ImGuiCol idx;
  ImDrawList *in_stack_ffffffffffffff18;
  ImDrawListSplitter *in_stack_ffffffffffffff20;
  ImVec2 *in_stack_ffffffffffffff28;
  ImDrawList *in_stack_ffffffffffffff30;
  float local_c4;
  float local_c0;
  float in_stack_ffffffffffffff48;
  ImU32 in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  ImDrawList *in_stack_ffffffffffffff60;
  ImVec2 local_90;
  ImVec2 local_88;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float fVar5;
  float _y;
  float _x;
  float _y_00;
  float in_stack_ffffffffffffffa4;
  ImVec2 local_54;
  float local_4c;
  float local_48;
  undefined1 local_44;
  undefined1 local_43;
  char local_42;
  undefined1 local_41;
  ImGuiTableColumn *local_40;
  int local_38;
  int local_34;
  float local_30;
  float local_2c;
  float local_28;
  undefined4 local_24;
  ImGuiTableInstanceData *local_20;
  ImDrawList *local_18;
  long local_10;
  long local_8;
  
  local_10 = *(long *)(in_RDI + 0x188);
  local_8 = in_RDI;
  bVar2 = ImRect::Overlaps((ImRect *)(*(long *)(in_RDI + 0x180) + 0x218),(ImRect *)(in_RDI + 0xf0));
  if (bVar2) {
    local_18 = *(ImDrawList **)(local_10 + 0x278);
    ImDrawListSplitter::SetCurrentChannel
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    ImDrawList::PushClipRect
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImVec2 *)in_stack_ffffffffffffff20,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0)
              );
    local_20 = TableGetInstanceData(in_stack_fffffffffffffef8,0);
    local_24 = 0x3f800000;
    fVar4 = *(float *)(local_8 + 0x104);
    local_2c = *(float *)(local_8 + 0x10c);
    local_28 = fVar4;
    if ((*(byte *)(local_8 + 0x20d) & 1) != 0) {
      in_stack_ffffffffffffff58 = *(float *)(local_8 + 0x10c);
      if (*(char *)(local_8 + 0x202) < '\x01') {
        in_stack_ffffffffffffff54 = *(float *)(local_8 + 0x114);
      }
      else {
        in_stack_ffffffffffffff54 = *(float *)(local_8 + 0x104);
      }
      fVar4 = ImMin<float>(in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff54 + local_20->LastFirstRowHeight);
    }
    local_30 = fVar4;
    if ((*(uint *)(local_8 + 4) & 0x200) != 0) {
      for (local_34 = 0; local_34 < *(int *)(local_8 + 0x74); local_34 = local_34 + 1) {
        if ((*(ulong *)(local_8 + 0x48) & 1L << ((byte)local_34 & 0x3f)) != 0) {
          pcVar3 = ImSpan<signed_char>::operator[]((ImSpan<signed_char> *)(local_8 + 0x28),local_34)
          ;
          local_38 = (int)*pcVar3;
          local_40 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)(local_8 + 0x18),local_38);
          local_41 = *(char *)(local_8 + 0x1f5) == local_38;
          uVar1 = in_stack_ffffffffffffff4c & 0xffffff;
          if (*(char *)(local_8 + 0x1f7) == local_38) {
            uVar1 = CONCAT13(*(short *)(local_8 + 0x82) == *(short *)(local_8 + 0x80),
                             (int3)in_stack_ffffffffffffff4c);
          }
          in_stack_ffffffffffffff4c = uVar1;
          local_42 = (char)(in_stack_ffffffffffffff4c >> 0x18);
          local_43 = (local_40->Flags & 0x40000020U) == 0;
          local_44 = (int)*(char *)(local_8 + 0x204) == local_34 + 1;
          if ((((local_40->MaxX < *(float *)(local_8 + 0x128) ||
                 local_40->MaxX == *(float *)(local_8 + 0x128)) || (local_42 != '\0')) &&
              (((local_40->NextEnabledColumn != -1 || ((bool)local_43)) ||
               (((*(uint *)(local_8 + 4) & 0xe000) == 0x4000 &&
                ((*(uint *)(local_8 + 4) & 0x10000) == 0)))))) &&
             ((local_40->ClipRect).Min.x < local_40->MaxX)) {
            if ((((bool)local_41) || (local_42 != '\0')) || ((bool)local_44)) {
              local_4c = local_2c;
              idx = (ImGuiCol)((ulong)in_stack_ffffffffffffff10 >> 0x20);
              if (local_42 == '\0') {
                if ((bool)local_41) {
                  in_stack_ffffffffffffff48 =
                       (float)GetColorU32(idx,(float)in_stack_ffffffffffffff10);
                  local_48 = in_stack_ffffffffffffff48;
                }
                else {
                  in_stack_ffffffffffffff48 = *(float *)(local_8 + 0xa8);
                  local_48 = in_stack_ffffffffffffff48;
                }
              }
              else {
                in_stack_ffffffffffffff48 = (float)GetColorU32(idx,(float)in_stack_ffffffffffffff10)
                ;
                local_48 = in_stack_ffffffffffffff48;
              }
            }
            else {
              if ((*(uint *)(local_8 + 4) & 0x1800) == 0) {
                local_c0 = local_2c;
              }
              else {
                local_c0 = local_30;
              }
              local_4c = local_c0;
              if ((*(uint *)(local_8 + 4) & 0x1800) == 0) {
                local_c4 = *(float *)(local_8 + 0xac);
              }
              else {
                local_c4 = *(float *)(local_8 + 0xa8);
              }
              local_48 = local_c4;
            }
            if (local_28 < local_4c) {
              ImVec2::ImVec2(&local_54,local_40->MaxX,local_28);
              ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,local_40->MaxX,local_4c);
              ImDrawList::AddLine(in_stack_ffffffffffffff60,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,fVar4),
                                  in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
            }
          }
        }
      }
    }
    if ((*(uint *)(local_8 + 4) & 0x500) != 0) {
      fVar5 = (float)*(undefined8 *)(local_8 + 0xf0);
      _y = (float)((ulong)*(undefined8 *)(local_8 + 0xf0) >> 0x20);
      _x = (float)*(undefined8 *)(local_8 + 0xf8);
      _y_00 = (float)((ulong)*(undefined8 *)(local_8 + 0xf8) >> 0x20);
      if ((*(uint *)(local_8 + 4) & 0x500) == 0x500) {
        ImDrawList::AddRect((ImDrawList *)CONCAT44(in_stack_ffffffffffffffa4,_y_00),
                            (ImVec2 *)CONCAT44(_x,_y),
                            (ImVec2 *)CONCAT44(fVar5,*(undefined4 *)(local_8 + 0xa8)),
                            (ImU32)in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                            (ImDrawFlags)in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
      }
      else if ((*(uint *)(local_8 + 4) & 0x400) == 0) {
        if ((*(uint *)(local_8 + 4) & 0x100) != 0) {
          in_stack_ffffffffffffff00 = local_18;
          ImVec2::ImVec2(&local_88,_x,_y);
          ImDrawList::AddLine(in_stack_ffffffffffffff60,
                              (ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,fVar4),
                              in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
          ImVec2::ImVec2(&local_90,fVar5,_y_00);
          ImDrawList::AddLine(in_stack_ffffffffffffff60,
                              (ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,fVar4),
                              in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
        }
      }
      else {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,fVar5,_y_00);
        ImDrawList::AddLine(in_stack_ffffffffffffff60,
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,fVar4),
                            in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,_x,_y);
        ImDrawList::AddLine(in_stack_ffffffffffffff60,
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,fVar4),
                            in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      }
    }
    if ((((*(uint *)(local_8 + 4) & 0x80) != 0) &&
        (*(float *)(local_8 + 0x88) < *(float *)(local_8 + 0xfc))) &&
       ((fVar5 = *(float *)(local_8 + 0x88), *(float *)(local_8 + 0x134) <= fVar5 &&
        (fVar5 < *(float *)(local_8 + 0x13c))))) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,*(float *)(local_8 + 0xb0),fVar5);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff5c,*(float *)(local_8 + 0xb4),fVar5);
      ImDrawList::AddLine(in_stack_ffffffffffffff60,
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,fVar4),
                          in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    }
    ImDrawList::PopClipRect(in_stack_ffffffffffffff00);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table_instance->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}